

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DES.h
# Opt level: O1

void __thiscall DES::DES(DES *this,SequenceD<64> *key)

{
  (this->m_key).super_Sequence._vptr_Sequence = (_func_int **)&PTR_shift_00116d08;
  std::deque<int,_std::allocator<int>_>::deque
            (&(this->m_key).super_Sequence.m_bits,&(key->super_Sequence).m_bits);
  (this->m_key).super_Sequence._vptr_Sequence = (_func_int **)&PTR_shift_00116cc8;
  (this->m_key).m_other._vptr_Sequence = (_func_int **)&PTR_shift_00116d08;
  std::deque<int,_std::allocator<int>_>::deque(&(this->m_key).m_other.m_bits,&(key->m_other).m_bits)
  ;
  return;
}

Assistant:

explicit DES(SequenceD<64> &key) : m_key(key){}